

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall
QRenderRule::QRenderRule(QRenderRule *this,QList<QCss::Declaration> *declarations,QObject *object)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  QStringView s_01;
  QStringView s_02;
  QLatin1StringView s_03;
  QByteArrayView layout;
  QSizeF QVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  int iVar6;
  BrushStyle BVar7;
  Int IVar8;
  ulong uVar9;
  char *pcVar10;
  qsizetype qVar11;
  const_reference pDVar12;
  DeclarationData *pDVar13;
  QStyleSheetBorderData *pQVar14;
  QStyleSheetBorderImageData *pQVar15;
  QStyleSheetBackgroundData *pQVar16;
  const_reference pVVar17;
  QColor *pQVar18;
  const_iterator ppcVar19;
  QWidget *pQVar20;
  QFont *pQVar21;
  QSize *pQVar22;
  QVariant *this_00;
  undefined8 *in_RDX;
  QList<QCss::Declaration> *in_RSI;
  undefined4 *in_RDI;
  QBrush *this_01;
  long in_FS_OFFSET;
  QLatin1StringView QVar23;
  undefined1 auVar24 [16];
  QStyleSheetStyle *style;
  QWidget *widget_1;
  qreal pixelSize;
  QWidget *widget;
  bool isEmSize;
  value_type sh;
  const_iterator __end6;
  const_iterator __begin6;
  array<const_char_*,_90UL> *__range6;
  bool knownStyleHint;
  int role;
  int i_4;
  QStyleSheetBorderImageData *bi;
  Declaration *decl;
  int i_3;
  int i_2;
  int i_1;
  int i;
  size_t RuntimeThreshold_1;
  size_t RuntimeThreshold;
  size_t i_5;
  size_t i_6;
  int integer;
  QSizeF newSize;
  qreal emexSize;
  QFontMetrics fontMetrics;
  QString valueString;
  QLatin1StringView styleHint;
  TileMode vertStretch;
  TileMode horizStretch;
  QString uri_1;
  int adj;
  QSize size;
  QIcon icon;
  QSize imgSize;
  QIcon imgIcon;
  QBrush accent;
  QBrush placeHolderTextForeground;
  QBrush alternateBackground;
  QBrush selectedBackground;
  QBrush selectedForeground;
  QBrush foreground;
  QPixmap pixmap;
  Origin clip;
  Attachment attachment;
  Alignment alignment;
  Repeat repeat;
  QString uri;
  QBrush brush;
  int spacing;
  Alignment textAlignment;
  PositionMode mode;
  Alignment position;
  Origin origin;
  int bottom;
  int right;
  int top;
  int left;
  int maxh;
  int maxw;
  int minh;
  int minw;
  int h;
  int w;
  QFont fontForSize;
  ValueExtractor v;
  QPalette palette;
  QVariant hintValue;
  int cuts [4];
  int offsets [4];
  QSize radii [4];
  BorderStyle styles [4];
  int borders [4];
  int paddings [4];
  int margins [4];
  QStyleSheetOutlineData *in_stack_fffffffffffff7d8;
  QStyleSheetGeometryData *o;
  QStyleSheetOutlineData *o_00;
  Origin *function;
  Repeat r;
  QStyleSheetBorderData *o_01;
  QSharedDataPointer<QStyleSheetOutlineData> *in_stack_fffffffffffff7e0;
  QSize *this_02;
  QRenderRule *this_03;
  undefined8 in_stack_fffffffffffff7e8;
  QStyleSheetStyle *this_04;
  QStyleSheetBackgroundData *in_stack_fffffffffffff7f0;
  QBrush *in_stack_fffffffffffff7f8;
  QBrush *pQVar25;
  int in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff804;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  undefined4 *puVar26;
  Attachment in_stack_fffffffffffff810;
  uint in_stack_fffffffffffff814;
  QBrush *in_stack_fffffffffffff818;
  QBrush *in_stack_fffffffffffff820;
  int *in_stack_fffffffffffff828;
  QStyleSheetBorderData *in_stack_fffffffffffff830;
  int local_7c4;
  bool local_771;
  undefined1 **local_728;
  QBrush *local_710;
  QStyleSheetStyle *local_6e8;
  const_iterator local_668;
  int local_63c;
  int local_628;
  int local_624;
  int local_620;
  int local_61c;
  ulong local_5c0;
  ulong local_5a8;
  QBrush local_590 [32];
  char local_570 [36];
  int local_54c [17];
  undefined1 local_508 [24];
  QLatin1StringView local_4f0;
  QIcon local_4e0 [4];
  char local_4c0 [32];
  qreal local_4a0;
  qreal local_498;
  QSizeF local_490;
  double local_480;
  undefined1 *local_478 [5];
  QString local_450;
  undefined1 local_438 [16];
  undefined4 local_424;
  undefined1 *local_420;
  undefined1 *local_418;
  QPixmap local_410 [24];
  QPixmap local_3f8 [24];
  QLatin1StringView local_3e0;
  TileMode local_3d0;
  TileMode local_3cc;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  undefined4 local_3b0;
  undefined1 *local_3a8;
  QIcon local_3a0;
  Origin local_398;
  undefined1 *local_394;
  Origin local_38c;
  QIcon local_388;
  undefined1 local_380 [8];
  undefined1 *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  Origin local_34c;
  QString local_348 [2];
  char local_318 [32];
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined1 local_2e0 [8];
  Origin local_2d8;
  undefined4 local_2d4;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  QHash<QString,_QVariant> local_2b8;
  undefined4 local_2ac;
  int local_2a8;
  int local_2a4;
  undefined1 local_2a0 [4];
  undefined1 local_29c [8];
  Attachment local_294;
  Origin local_290 [10];
  undefined1 *local_268;
  undefined1 *local_260;
  QPalette local_258;
  undefined8 local_248;
  undefined4 local_240;
  undefined2 local_23c;
  QColor *local_238;
  undefined8 local_230;
  QPalette local_228;
  ValueExtractor local_218 [64];
  undefined1 local_1d8 [16];
  QVariant local_1c8;
  QVariant local_1a8;
  QVariant local_188;
  QVariant local_168;
  QVariant local_148;
  QVariant local_128;
  QVariant local_108;
  QVariant local_e8;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  Origin o_02;
  int l;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = 0;
  QBrush::QBrush((QBrush *)(in_RDI + 2));
  QFont::QFont((QFont *)(in_RDI + 4));
  *(undefined1 *)(in_RDI + 8) = 0;
  QHash<QString,_QVariant>::QHash((QHash<QString,_QVariant> *)(in_RDI + 10));
  QSharedDataPointer<QStyleSheetPaletteData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetPaletteData> *)in_stack_fffffffffffff7e0,
             (QStyleSheetPaletteData *)in_stack_fffffffffffff7d8);
  QSharedDataPointer<QStyleSheetBoxData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetBoxData> *)in_stack_fffffffffffff7e0,
             (QStyleSheetBoxData *)in_stack_fffffffffffff7d8);
  QSharedDataPointer<QStyleSheetBackgroundData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetBackgroundData> *)in_stack_fffffffffffff7e0,
             (QStyleSheetBackgroundData *)in_stack_fffffffffffff7d8);
  QSharedDataPointer<QStyleSheetBorderData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetBorderData> *)in_stack_fffffffffffff7e0,
             &in_stack_fffffffffffff7d8->super_QStyleSheetBorderData);
  QSharedDataPointer<QStyleSheetOutlineData>::QSharedDataPointer
            (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  QSharedDataPointer<QStyleSheetGeometryData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetGeometryData> *)in_stack_fffffffffffff7e0,
             (QStyleSheetGeometryData *)in_stack_fffffffffffff7d8);
  QSharedDataPointer<QStyleSheetPositionData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetPositionData> *)in_stack_fffffffffffff7e0,
             (QStyleSheetPositionData *)in_stack_fffffffffffff7d8);
  QSharedDataPointer<QStyleSheetImageData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetImageData> *)in_stack_fffffffffffff7e0,
             (QStyleSheetImageData *)in_stack_fffffffffffff7d8);
  QSharedDataPointer<QStyleSheetImageData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetImageData> *)0x420f12);
  in_RDI[0x1e] = 0;
  QPainterPath::QPainterPath((QPainterPath *)(in_RDI + 0x20));
  local_1d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_1d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::palette();
  memset(local_218,0xaa,0x40);
  QCss::ValueExtractor::ValueExtractor(local_218,(QList_conflict2 *)in_RSI,(QPalette *)local_1d8);
  uVar5 = QCss::ValueExtractor::extractStyleFeatures();
  *in_RDI = uVar5;
  local_290[9] = 0xffffffff;
  local_290[8] = 0xffffffff;
  local_290[7] = 0xffffffff;
  local_290[6] = 0xffffffff;
  local_290[5] = 0xffffffff;
  local_290[4] = 0xffffffff;
  iVar6 = (int)((ulong)(local_290 + 4) >> 0x20);
  uVar9 = QCss::ValueExtractor::extractGeometry
                    ((int *)local_218,(int *)(local_290 + 9),(int *)(local_290 + 8),
                     (int *)(local_290 + 7),(int *)(local_290 + 6),(int *)(local_290 + 5));
  if ((uVar9 & 1) != 0) {
    operator_new(0x1c);
    o = (QStyleSheetGeometryData *)CONCAT44(iVar6,local_290[4]);
    QStyleSheetGeometryData::QStyleSheetGeometryData
              ((QStyleSheetGeometryData *)in_stack_fffffffffffff7f0,
               (int)((ulong)in_stack_fffffffffffff7e8 >> 0x20),(int)in_stack_fffffffffffff7e8,
               (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20),(int)in_stack_fffffffffffff7e0,iVar6,
               in_stack_fffffffffffff800);
    QSharedDataPointer<QStyleSheetGeometryData>::operator=
              ((QSharedDataPointer<QStyleSheetGeometryData> *)in_stack_fffffffffffff7e0,o);
  }
  local_290[3] = 0;
  local_290[2] = 0;
  local_290[1] = 0;
  local_290[0] = Origin_Unknown;
  local_294 = Attachment_Unknown;
  local_29c._4_4_ = -0x55555556;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x4210e1);
  local_29c._0_4_ = 0;
  local_2a0 = (undefined1  [4])0xaaaaaaaa;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x421106);
  o_00 = (QStyleSheetOutlineData *)(local_29c + 4);
  this_02 = (QSize *)local_29c;
  this_04 = (QStyleSheetStyle *)local_2a0;
  uVar9 = QCss::ValueExtractor::extractPosition
                    ((int *)local_218,(int *)(local_290 + 3),(int *)(local_290 + 2),
                     (int *)(local_290 + 1),local_290,(QFlags_conflict1 *)&local_294,
                     (PositionMode *)o_00,(QFlags_conflict1 *)this_02);
  if ((uVar9 & 1) != 0) {
    operator_new(0x24);
    local_2a4 = local_29c._4_4_;
    local_2a8 = (int)local_2a0;
    o_02 = (Origin)((ulong)o_00 >> 0x20);
    o_00 = (QStyleSheetOutlineData *)CONCAT44(o_02,local_29c._4_4_);
    iVar6 = (int)((ulong)this_02 >> 0x20);
    this_02 = (QSize *)CONCAT44(iVar6,local_29c._0_4_);
    l = (int)((ulong)this_04 >> 0x20);
    this_04 = (QStyleSheetStyle *)CONCAT44(l,local_2a0);
    QStyleSheetPositionData::QStyleSheetPositionData
              ((QStyleSheetPositionData *)in_stack_fffffffffffff7f0,l,(int)local_2a0,iVar6,
               local_29c._0_4_,o_02,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffff7f8 >> 0x20,0),
               (PositionMode)in_stack_fffffffffffff818,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84(in_stack_fffffffffffff7f8,0));
    QSharedDataPointer<QStyleSheetPositionData>::operator=
              ((QSharedDataPointer<QStyleSheetPositionData> *)this_02,
               (QStyleSheetPositionData *)o_00);
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_2ac = 0xffffffff;
  for (local_61c = 0; local_61c < 4; local_61c = local_61c + 1) {
    *(undefined4 *)((long)&local_28 + (long)local_61c * 4) = 0;
    *(undefined4 *)((long)&local_18 + (long)local_61c * 4) = 0;
  }
  uVar9 = QCss::ValueExtractor::extractBox((int *)local_218,(int *)&local_18,(int *)&local_28);
  if ((uVar9 & 1) != 0) {
    operator_new(0x28);
    QStyleSheetBoxData::QStyleSheetBoxData
              ((QStyleSheetBoxData *)in_stack_fffffffffffff7f0,(int *)this_04,(int *)this_02,
               (int)((ulong)o_00 >> 0x20));
    QSharedDataPointer<QStyleSheetBoxData>::operator=
              ((QSharedDataPointer<QStyleSheetBoxData> *)this_02,(QStyleSheetBoxData *)o_00);
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_710 = (QBrush *)&local_58;
  do {
    QBrush::QBrush(local_710);
    local_710 = local_710 + 8;
  } while (local_710 != (QBrush *)&local_38);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_728 = &local_88;
  do {
    QSize::QSize(this_02);
    local_728 = local_728 + 1;
  } while (local_728 != &local_68);
  for (local_620 = 0; local_620 < 4; local_620 = local_620 + 1) {
    *(undefined4 *)((long)&local_38 + (long)local_620 * 4) = 0;
    *(undefined4 *)((long)&local_68 + (long)local_620 * 4) = 1;
  }
  uVar9 = QCss::ValueExtractor::extractBorder
                    ((int *)local_218,(QBrush *)&local_38,(BorderStyle *)&local_58,
                     (QSize *)&local_68);
  if ((uVar9 & 1) != 0) {
    operator_new(0x70);
    QStyleSheetBorderData::QStyleSheetBorderData
              (in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820,
               (BorderStyle *)in_stack_fffffffffffff818,
               (QSize *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    QSharedDataPointer<QStyleSheetBorderData>::operator=
              ((QSharedDataPointer<QStyleSheetBorderData> *)this_02,
               &o_00->super_QStyleSheetBorderData);
  }
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  for (local_624 = 0; local_624 < 4; local_624 = local_624 + 1) {
    *(undefined4 *)((long)&local_98 + (long)local_624 * 4) = 0;
    *(undefined4 *)((long)&local_38 + (long)local_624 * 4) = 0;
    *(undefined4 *)((long)&local_68 + (long)local_624 * 4) = 1;
  }
  uVar9 = QCss::ValueExtractor::extractOutline
                    ((int *)local_218,(QBrush *)&local_38,(BorderStyle *)&local_58,
                     (QSize *)&local_68,(int *)&local_88);
  if ((uVar9 & 1) != 0) {
    operator_new(0x80);
    QStyleSheetOutlineData::QStyleSheetOutlineData
              ((QStyleSheetOutlineData *)
               CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
               (int *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
               (QBrush *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
               (BorderStyle *)in_stack_fffffffffffff7f8,(QSize *)in_stack_fffffffffffff7f0,
               (int *)this_04);
    QSharedDataPointer<QStyleSheetOutlineData>::operator=
              ((QSharedDataPointer<QStyleSheetOutlineData> *)this_02,o_00);
  }
  local_2b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_2b8);
  local_2d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_2c8 = &DAT_aaaaaaaaaaaaaaaa;
  local_2c0 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x4216a9);
  local_2d4 = 4;
  local_2d8 = 0xaaaaaaaa;
  local_2d8 = (Origin)Qt::operator|((enum_type)((ulong)this_02 >> 0x20),(enum_type)this_02);
  local_2e0._4_4_ = Origin_Border;
  local_294 = Attachment_Fixed;
  local_2e0._0_4_ = 2;
  function = (Origin *)(local_2e0 + 4);
  this_03 = (QRenderRule *)local_2e0;
  uVar9 = QCss::ValueExtractor::extractBackground
                    ((QBrush *)local_218,(QString *)&local_2b8,(Repeat *)&local_2d0,
                     (QFlags_conflict1 *)&local_2d4,&local_2d8,&local_294,function);
  if ((uVar9 & 1) != 0) {
    local_2f8 = &DAT_aaaaaaaaaaaaaaaa;
    local_2f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_2e8 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleSheetStyle::loadPixmap
              ((QString *)in_stack_fffffffffffff818,
               (QObject *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    iVar6 = (int)((ulong)this_03 >> 0x20);
    bVar3 = QString::isEmpty((QString *)0x4217a6);
    if ((!bVar3) && (uVar9 = QPixmap::isNull(), (uVar9 & 1) != 0)) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffff7f0,(char *)this_04,iVar6,(char *)function)
      ;
      QDir::toNativeSeparators((QString *)local_348);
      QtPrivate::asString(local_348);
      QString::toLocal8Bit((QString *)in_stack_fffffffffffff7f8);
      pcVar10 = QByteArray::constData((QByteArray *)0x421819);
      QMessageLogger::warning(local_318,"Could not create pixmap from %s",pcVar10);
      QByteArray::~QByteArray((QByteArray *)0x42183f);
      QString::~QString((QString *)0x42184c);
    }
    r = (Repeat)((ulong)function >> 0x20);
    operator_new(0x40);
    local_34c = local_2d8;
    pQVar16 = (QStyleSheetBackgroundData *)CONCAT44(r,local_2e0._4_4_);
    this_03 = (QRenderRule *)CONCAT44(iVar6,local_2e0._0_4_);
    QStyleSheetBackgroundData::QStyleSheetBackgroundData
              (in_stack_fffffffffffff7f0,(QBrush *)this_04,(QPixmap *)this_03,r,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffff7f8 >> 0x20,0),local_2e0._4_4_,
               in_stack_fffffffffffff810,(Origin)in_stack_fffffffffffff818);
    QSharedDataPointer<QStyleSheetBackgroundData>::operator=
              ((QSharedDataPointer<QStyleSheetBackgroundData> *)this_03,pQVar16);
    QPixmap::~QPixmap((QPixmap *)&local_2f8);
  }
  local_358 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_358);
  local_360 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_360);
  local_368 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_368);
  local_370 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_370);
  local_378 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_378);
  local_380 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)local_380);
  o_01 = (QStyleSheetBorderData *)local_380;
  uVar9 = QCss::ValueExtractor::extractPalette
                    ((QBrush *)local_218,(QBrush *)&local_358,(QBrush *)&local_360,
                     (QBrush *)&local_368,(QBrush *)&local_370,(QBrush *)&local_378);
  if ((uVar9 & 1) != 0) {
    operator_new(0x38);
    o_01 = (QStyleSheetBorderData *)local_380;
    QStyleSheetPaletteData::QStyleSheetPaletteData
              ((QStyleSheetPaletteData *)
               CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
               in_stack_fffffffffffff7f8,(QBrush *)in_stack_fffffffffffff7f0,(QBrush *)this_04,
               (QBrush *)this_03,(QBrush *)o_01,
               (QBrush *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    QSharedDataPointer<QStyleSheetPaletteData>::operator=
              ((QSharedDataPointer<QStyleSheetPaletteData> *)this_03,(QStyleSheetPaletteData *)o_01)
    ;
  }
  local_388.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&local_388);
  QFlags<Qt::AlignmentFlag>::QFlags
            ((QFlags<Qt::AlignmentFlag> *)this_03,(AlignmentFlag)((ulong)o_01 >> 0x20));
  local_2d8 = local_38c;
  local_394 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)this_03);
  uVar9 = QCss::ValueExtractor::extractImage
                    ((QIcon *)local_218,(QFlags_conflict1 *)&local_388,(QSize *)&local_2d8);
  if ((uVar9 & 1) != 0) {
    operator_new(0x20);
    local_398 = local_2d8;
    QStyleSheetImageData::QStyleSheetImageData
              ((QStyleSheetImageData *)in_stack_fffffffffffff7f0,(QIcon *)this_04,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffff7f8 >> 0x20,0),(QSize *)this_03);
    QSharedDataPointer<QStyleSheetImageData>::operator=
              ((QSharedDataPointer<QStyleSheetImageData> *)this_03,(QStyleSheetImageData *)o_01);
  }
  local_3a0.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&local_3a0);
  local_3a8 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)this_03);
  uVar9 = QCss::ValueExtractor::extractIcon((QIcon *)local_218,(QSize *)&local_3a0);
  if ((uVar9 & 1) != 0) {
    operator_new(0x20);
    QFlags<Qt::AlignmentFlag>::QFlags
              ((QFlags<Qt::AlignmentFlag> *)this_03,(AlignmentFlag)((ulong)o_01 >> 0x20));
    QStyleSheetImageData::QStyleSheetImageData
              ((QStyleSheetImageData *)in_stack_fffffffffffff7f0,(QIcon *)this_04,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffff7f8 >> 0x20,0),(QSize *)this_03);
    QSharedDataPointer<QStyleSheetImageData>::operator=
              ((QSharedDataPointer<QStyleSheetImageData> *)this_03,(QStyleSheetImageData *)o_01);
  }
  local_3b0 = 0xffffff01;
  bVar2 = QCss::ValueExtractor::extractFont((QFont *)local_218,in_RDI + 4);
  *(byte *)(in_RDI + 8) = bVar2 & 1;
  if (in_RDX != (undefined8 *)0x0) {
    (**(code **)*in_RDX)();
    pcVar10 = (char *)QMetaObject::className();
    iVar6 = qstrcmp(pcVar10,"QTipLabel");
    if (iVar6 == 0) {
      QToolTip::palette();
      QPalette::operator=((QPalette *)this_03,(QPalette *)o_01);
      QPalette::~QPalette(&local_228);
    }
  }
  puVar26 = (undefined4 *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808);
  local_628 = 0;
  do {
    qVar11 = QList<QCss::Declaration>::size(in_RSI);
    if (qVar11 <= local_628) {
      bVar3 = hasBorder(this_03);
      if (bVar3) {
        pQVar20 = qobject_cast<QWidget_const*>((QObject *)o_01);
        if (pQVar20 != (QWidget *)0x0) {
          local_6e8 = globalStyleSheetStyle;
          if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
            QWidget::style((QWidget *)o_01);
            local_6e8 = qt_styleSheet((QStyle *)0x422e81);
          }
          if (local_6e8 != (QStyleSheetStyle *)0x0) {
            QStyleSheetStyle::nativeFrameWidth(this_04,(QWidget *)this_03);
            fixupBorder((QRenderRule *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810)
                        ,(int)((ulong)puVar26 >> 0x20));
          }
        }
        border((QRenderRule *)0x422ec7);
        bVar3 = QStyleSheetBorderData::hasBorderImage((QStyleSheetBorderData *)this_03);
        if (bVar3) {
          QBrush::QBrush(local_590);
          QBrush::operator=((QBrush *)this_03,(QBrush *)o_01);
          QBrush::~QBrush(local_590);
        }
      }
      QIcon::~QIcon(&local_3a0);
      QIcon::~QIcon(&local_388);
      QBrush::~QBrush((QBrush *)local_380);
      QBrush::~QBrush((QBrush *)&local_378);
      QBrush::~QBrush((QBrush *)&local_370);
      QBrush::~QBrush((QBrush *)&local_368);
      QBrush::~QBrush((QBrush *)&local_360);
      QBrush::~QBrush((QBrush *)&local_358);
      QString::~QString((QString *)0x422f7f);
      QBrush::~QBrush((QBrush *)&local_2b8);
      pQVar25 = (QBrush *)&local_58;
      this_01 = (QBrush *)&local_38;
      do {
        this_01 = this_01 + -8;
        QBrush::~QBrush(this_01);
      } while (this_01 != pQVar25);
      QCss::ValueExtractor::~ValueExtractor((ValueExtractor *)this_03);
      QPalette::~QPalette((QPalette *)local_1d8);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    pDVar12 = QList<QCss::Declaration>::at((QList<QCss::Declaration> *)this_03,(qsizetype)o_01);
    pDVar13 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                        ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                         0x421cdc);
    if (pDVar13->propertyId == BorderImage) {
      local_3c8 = &DAT_aaaaaaaaaaaaaaaa;
      local_3c0 = &DAT_aaaaaaaaaaaaaaaa;
      local_3b8 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x421d20);
      local_3cc = 0xaaaaaaaa;
      local_3d0 = 0xaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_a0 = &DAT_aaaaaaaaaaaaaaaa;
      QCss::Declaration::borderImageValue
                ((QString *)pDVar12,(int *)&local_3c8,(TileMode *)&local_a8,&local_3cc);
      bVar3 = QString::isEmpty((QString *)0x421d8e);
      local_771 = true;
      if (!bVar3) {
        local_3e0 = Qt::Literals::StringLiterals::operator____L1((char *)this_04,(size_t)this_03);
        local_771 = ::operator==((QString *)this_04,(QLatin1StringView *)this_03);
      }
      if (local_771 == false) {
        bVar3 = QSharedDataPointer<QStyleSheetBorderData>::operator!
                          ((QSharedDataPointer<QStyleSheetBorderData> *)0x421e86);
        if (bVar3) {
          operator_new(0x70);
          QStyleSheetBorderData::QStyleSheetBorderData
                    ((QStyleSheetBorderData *)
                     CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
          QSharedDataPointer<QStyleSheetBorderData>::operator=
                    ((QSharedDataPointer<QStyleSheetBorderData> *)this_03,o_01);
        }
        QSharedDataPointer<QStyleSheetBorderData>::operator->
                  ((QSharedDataPointer<QStyleSheetBorderData> *)this_03);
        bVar3 = QSharedDataPointer<QStyleSheetBorderImageData>::operator!
                          ((QSharedDataPointer<QStyleSheetBorderImageData> *)0x421edc);
        if (bVar3) {
          operator_new(0x50);
          QStyleSheetBorderImageData::QStyleSheetBorderImageData
                    ((QStyleSheetBorderImageData *)this_03);
          QSharedDataPointer<QStyleSheetBorderData>::operator->
                    ((QSharedDataPointer<QStyleSheetBorderData> *)this_03);
          QSharedDataPointer<QStyleSheetBorderImageData>::operator=
                    ((QSharedDataPointer<QStyleSheetBorderImageData> *)this_03,
                     (QStyleSheetBorderImageData *)o_01);
        }
        QSharedDataPointer<QStyleSheetBorderData>::operator->
                  ((QSharedDataPointer<QStyleSheetBorderData> *)this_03);
        pQVar15 = ::QSharedDataPointer::operator_cast_to_QStyleSheetBorderImageData_
                            ((QSharedDataPointer<QStyleSheetBorderImageData> *)this_03);
        QStyleSheetStyle::loadPixmap
                  ((QString *)in_stack_fffffffffffff818,
                   (QObject *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
        QPixmap::operator=((QPixmap *)this_04,(QPixmap *)this_03);
        QPixmap::~QPixmap(local_410);
        for (local_63c = 0; local_63c < 4; local_63c = local_63c + 1) {
          pQVar15->cuts[local_63c] = *(int *)((long)&local_a8 + (long)local_63c * 4);
        }
        pQVar15->horizStretch = local_3cc;
        pQVar15->vertStretch = local_3d0;
      }
      else {
        pQVar14 = ::QSharedDataPointer::operator_cast_to_QStyleSheetBorderData_
                            ((QSharedDataPointer<QStyleSheetBorderData> *)this_03);
        if (pQVar14 != (QStyleSheetBorderData *)0x0) {
          QSharedDataPointer<QStyleSheetBorderData>::operator->
                    ((QSharedDataPointer<QStyleSheetBorderData> *)this_03);
          pQVar15 = ::QSharedDataPointer::operator_cast_to_QStyleSheetBorderImageData_
                              ((QSharedDataPointer<QStyleSheetBorderImageData> *)this_03);
          if (pQVar15 != (QStyleSheetBorderImageData *)0x0) {
            QPixmap::QPixmap(local_3f8);
            QSharedDataPointer<QStyleSheetBorderData>::operator->
                      ((QSharedDataPointer<QStyleSheetBorderData> *)this_03);
            QSharedDataPointer<QStyleSheetBorderImageData>::operator->
                      ((QSharedDataPointer<QStyleSheetBorderImageData> *)this_03);
            QPixmap::operator=((QPixmap *)this_04,(QPixmap *)this_03);
            QPixmap::~QPixmap(local_3f8);
          }
        }
      }
      QString::~QString((QString *)0x422005);
    }
    else {
      pDVar13 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                          ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                           0x422017);
      if (pDVar13->propertyId == QtBackgroundRole) {
        pQVar16 = ::QSharedDataPointer::operator_cast_to_QStyleSheetBackgroundData_
                            ((QSharedDataPointer<QStyleSheetBackgroundData> *)this_03);
        if (pQVar16 != (QStyleSheetBackgroundData *)0x0) {
          QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                    ((QSharedDataPointer<QStyleSheetBackgroundData> *)this_03);
          BVar7 = QBrush::style((QBrush *)0x422055);
          if (BVar7 != NoBrush) goto LAB_00422e06;
        }
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x42206c);
        pVVar17 = QList<QCss::Value>::at((QList<QCss::Value> *)this_03,(qsizetype)o_01);
        iVar6 = ::QVariant::toInt((bool *)&pVVar17->variant);
        if ((0x3a < iVar6) && (iVar6 < 0x51)) {
          pQVar18 = QPalette::color((QPalette *)this_03,(ColorRole)((ulong)o_01 >> 0x20));
          local_238 = *(QColor **)pQVar18;
          local_230 = *(undefined8 *)((long)&pQVar18->ct + 4);
          QBrush::operator=((QBrush *)(in_RDI + 2),local_238);
        }
      }
      else {
        pDVar13 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                             0x422108);
        QVar23 = Qt::Literals::StringLiterals::operator____L1((char *)this_04,(size_t)this_03);
        uVar9 = QString::startsWith((QLatin1String *)&pDVar13->property,
                                    (CaseSensitivity)QVar23.m_size);
        if ((uVar9 & 1) == 0) {
          pDVar13 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                               0x42216c);
          if (pDVar13->propertyId == UnknownProperty) {
            bVar3 = false;
            local_668 = std::array<const_char_*,_90UL>::begin((array<const_char_*,_90UL> *)0x422199)
            ;
            ppcVar19 = std::array<const_char_*,_90UL>::end((array<const_char_*,_90UL> *)0x4221ad);
LAB_004221b5:
            if (local_668 != ppcVar19) {
              local_420 = &DAT_aaaaaaaaaaaaaaaa;
              local_418 = &DAT_aaaaaaaaaaaaaaaa;
              QLatin1String::QLatin1String
                        ((QLatin1String *)in_stack_fffffffffffff7f0,(char *)this_04);
              QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                        ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                         0x42221e);
              bVar4 = ::operator==((QString *)this_04,(QLatin1StringView *)this_03);
              if (!bVar4) break;
              local_c8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
              local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_b0 = &DAT_aaaaaaaaaaaaaaaa;
              ::QVariant::QVariant((QVariant *)0x422284);
              Qt::Literals::StringLiterals::operator____L1((char *)this_04,(size_t)this_03);
              QVar23.m_size._4_4_ = in_stack_fffffffffffff804;
              QVar23.m_size._0_4_ = in_stack_fffffffffffff800;
              QVar23.m_data._0_4_ = (int)puVar26;
              QVar23.m_data._4_4_ = (int)((ulong)puVar26 >> 0x20);
              bVar3 = QLatin1String::endsWith((QLatin1String *)o_01,QVar23,CaseInsensitive);
              if (bVar3) {
                local_424 = QCss::Declaration::alignmentValue();
                IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_424);
                ::QVariant::QVariant(&local_e8,IVar8);
                ::QVariant::operator=((QVariant *)this_04,(QVariant *)this_03);
                ::QVariant::~QVariant(&local_e8);
              }
              else {
                Qt::Literals::StringLiterals::operator____L1((char *)this_04,(size_t)this_03);
                s.m_size._4_4_ = in_stack_fffffffffffff804;
                s.m_size._0_4_ = in_stack_fffffffffffff800;
                s.m_data._0_4_ = (int)puVar26;
                s.m_data._4_4_ = (int)((ulong)puVar26 >> 0x20);
                bVar3 = QLatin1String::endsWith((QLatin1String *)o_01,s,CaseInsensitive);
                if (bVar3) {
                  QPalette::QPalette(&local_258);
                  auVar24 = QCss::Declaration::colorValue((QPalette *)pDVar12);
                  local_248 = auVar24._0_8_;
                  local_438._8_4_ = auVar24._8_4_;
                  local_240 = local_438._8_4_;
                  local_438._12_2_ = auVar24._12_2_;
                  local_23c = local_438._12_2_;
                  local_438 = auVar24;
                  iVar6 = QColor::rgba();
                  ::QVariant::QVariant(&local_108,iVar6);
                  ::QVariant::operator=((QVariant *)this_04,(QVariant *)this_03);
                  ::QVariant::~QVariant(&local_108);
                  QPalette::~QPalette(&local_258);
                }
                else {
                  Qt::Literals::StringLiterals::operator____L1((char *)this_04,(size_t)this_03);
                  s_00.m_size._4_4_ = in_stack_fffffffffffff804;
                  s_00.m_size._0_4_ = in_stack_fffffffffffff800;
                  s_00.m_data._0_4_ = (int)puVar26;
                  s_00.m_data._4_4_ = (int)((ulong)puVar26 >> 0x20);
                  bVar3 = QLatin1String::endsWith((QLatin1String *)o_01,s_00,CaseInsensitive);
                  if (bVar3) {
                    local_450.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_450.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    local_450.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                               0x4224be);
                    QList<QCss::Value>::at((QList<QCss::Value> *)this_03,(qsizetype)o_01);
                    ::QVariant::toString();
                    std::data<char16_t_const,3ul>((char16_t (*) [3])L"em");
                    for (local_5c0 = 0; (local_5c0 < 3 && (L"em"[local_5c0] != L'\0'));
                        local_5c0 = local_5c0 + 1) {
                    }
                    QStringView::QStringView<char16_t,_true>
                              ((QStringView *)in_stack_fffffffffffff7f0,(char16_t *)this_04,
                               (qsizetype)this_03);
                    s_01.m_size._4_4_ = in_stack_fffffffffffff804;
                    s_01.m_size._0_4_ = in_stack_fffffffffffff800;
                    s_01.m_data._0_4_ = (int)puVar26;
                    s_01.m_data._4_4_ = (int)((ulong)puVar26 >> 0x20);
                    bVar3 = QString::endsWith((QString *)o_01,s_01,CaseInsensitive);
                    if (bVar3) {
LAB_00422710:
                      local_268 = &DAT_aaaaaaaaaaaaaaaa;
                      local_260 = &DAT_aaaaaaaaaaaaaaaa;
                      QFont::QFont((QFont *)&local_268,(QFont *)(in_RDI + 4));
                      if ((*(byte *)(in_RDI + 8) & 1) == 0) {
                        pQVar20 = qobject_cast<QWidget_const*>((QObject *)o_01);
                        if (pQVar20 != (QWidget *)0x0) {
                          pQVar21 = QWidget::font(pQVar20);
                          QFont::operator=((QFont *)&local_268,pQVar21);
                        }
                      }
                      local_478[0] = &DAT_aaaaaaaaaaaaaaaa;
                      QFontMetrics::QFontMetrics((QFontMetrics *)local_478,(QFont *)&local_268);
                      if (bVar3) {
                        local_7c4 = QFontMetrics::height();
                      }
                      else {
                        local_7c4 = QFontMetrics::xHeight();
                      }
                      local_480 = 0.0;
                      if (bVar3) {
                        in_stack_fffffffffffff828 = (int *)0xb43bc1;
                      }
                      else {
                        in_stack_fffffffffffff828 = (int *)0xb393b0;
                      }
                      uVar9 = QCss::Declaration::realValue((double *)pDVar12,(char *)&local_480);
                      if (((uVar9 & 1) == 0) || (local_480 <= 0.0)) {
                        QMessageLogger::QMessageLogger
                                  ((QMessageLogger *)in_stack_fffffffffffff7f0,(char *)this_04,
                                   (int)((ulong)this_03 >> 0x20),(char *)o_01);
                        if (bVar3) {
                          in_stack_fffffffffffff818 = (QBrush *)0xb43bc1;
                        }
                        else {
                          in_stack_fffffffffffff818 = (QBrush *)0xb393b0;
                        }
                        in_stack_fffffffffffff820 = in_stack_fffffffffffff818;
                        QtPrivate::asString(&local_450);
                        QString::toLocal8Bit((QString *)in_stack_fffffffffffff7f8);
                        pcVar10 = QByteArray::constData((QByteArray *)0x4229e8);
                        QMessageLogger::warning
                                  (local_4c0,"Invalid \'%s\' size for %s. Skipping.",
                                   in_stack_fffffffffffff818,pcVar10);
                        QByteArray::~QByteArray((QByteArray *)0x422a13);
                      }
                      else {
                        local_490.wd = -NAN;
                        local_490.ht = -NAN;
                        QSizeF::QSizeF(&local_490,local_480 * (double)local_7c4,
                                       local_480 * (double)local_7c4);
                        ::QVariant::fromValue<QSizeF>((QSizeF *)this_04);
                        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>
                                    *)0x4228f1);
                        ::QVariant::operator=((QVariant *)this_04,(QVariant *)this_03);
                        ::QVariant::~QVariant(&local_128);
                        local_4a0 = local_490.wd;
                        local_498 = local_490.ht;
                        QVar1.ht = local_490.ht;
                        QVar1.wd = local_490.wd;
                        ::QVariant::QVariant(&local_148,QVar1);
                        ::QVariant::operator=((QVariant *)this_04,(QVariant *)this_03);
                        ::QVariant::~QVariant(&local_148);
                      }
                      QFontMetrics::~QFontMetrics((QFontMetrics *)local_478);
                      QFont::~QFont((QFont *)&local_268);
                    }
                    else {
                      std::data<char16_t_const,3ul>((char16_t (*) [3])L"ex");
                      for (local_5a8 = 0; (local_5a8 < 3 && (L"ex"[local_5a8] != L'\0'));
                          local_5a8 = local_5a8 + 1) {
                      }
                      QStringView::QStringView<char16_t,_true>
                                ((QStringView *)in_stack_fffffffffffff7f0,(char16_t *)this_04,
                                 (qsizetype)this_03);
                      s_02.m_size._4_4_ = in_stack_fffffffffffff804;
                      s_02.m_size._0_4_ = in_stack_fffffffffffff800;
                      s_02.m_data._0_4_ = (int)puVar26;
                      s_02.m_data._4_4_ = (int)((ulong)puVar26 >> 0x20);
                      bVar4 = QString::endsWith((QString *)o_01,s_02,CaseInsensitive);
                      if (bVar4) goto LAB_00422710;
                      pQVar22 = (QSize *)QCss::Declaration::sizeValue();
                      ::QVariant::QVariant(&local_168,pQVar22);
                      ::QVariant::operator=((QVariant *)this_04,(QVariant *)this_03);
                      ::QVariant::~QVariant(&local_168);
                    }
                    QString::~QString((QString *)0x422a88);
                  }
                  else {
                    Qt::Literals::StringLiterals::operator____L1((char *)this_04,(size_t)this_03);
                    s_03.m_size._4_4_ = in_stack_fffffffffffff804;
                    s_03.m_size._0_4_ = in_stack_fffffffffffff800;
                    s_03.m_data._0_4_ = (int)puVar26;
                    s_03.m_data._4_4_ = (int)((ulong)puVar26 >> 0x20);
                    bVar3 = QLatin1String::endsWith((QLatin1String *)o_01,s_03,CaseInsensitive);
                    if (bVar3) {
                      QCss::Declaration::iconValue();
                      QIcon::operator_cast_to_QVariant((QIcon *)&local_188);
                      ::QVariant::operator=((QVariant *)this_04,(QVariant *)this_03);
                      ::QVariant::~QVariant(&local_188);
                      QIcon::~QIcon(local_4e0);
                    }
                    else {
                      local_4f0 = Qt::Literals::StringLiterals::operator____L1
                                            ((char *)this_04,(size_t)this_03);
                      bVar3 = ::operator==((QLatin1StringView *)this_03,(QLatin1StringView *)o_01);
                      in_stack_fffffffffffff814 = in_stack_fffffffffffff814 & 0xffffff;
                      if (bVar3) {
                        pDVar13 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::
                                  operator->((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>
                                              *)0x422b86);
                        qVar11 = QList<QCss::Value>::size(&pDVar13->values);
                        in_stack_fffffffffffff814 = in_stack_fffffffffffff814 & 0xffffff;
                        if (qVar11 != 0) {
                          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::
                          operator->((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>
                                      *)0x422bae);
                          pVVar17 = QList<QCss::Value>::at
                                              ((QList<QCss::Value> *)this_03,(qsizetype)o_01);
                          in_stack_fffffffffffff814 =
                               CONCAT13(pVVar17->type == String,(int3)in_stack_fffffffffffff814);
                        }
                      }
                      if ((char)(in_stack_fffffffffffff814 >> 0x18) == '\0') {
                        local_54c[0] = -0x55555556;
                        QCss::Declaration::intValue((int *)pDVar12,(char *)local_54c);
                        ::QVariant::QVariant(&local_1c8,local_54c[0]);
                        ::QVariant::operator=((QVariant *)this_04,(QVariant *)this_03);
                        ::QVariant::~QVariant(&local_1c8);
                      }
                      else {
                        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>
                                    *)0x422be2);
                        QList<QCss::Value>::at((QList<QCss::Value> *)this_03,(qsizetype)o_01);
                        ::QVariant::toString();
                        QString::toLatin1((QString *)o_01);
                        QByteArrayView::QByteArrayView<QByteArray,_true>
                                  ((QByteArrayView *)in_stack_fffffffffffff7f0,(QByteArray *)this_04
                                  );
                        layout.m_data = (storage_type *)in_stack_fffffffffffff828;
                        layout.m_size = (qsizetype)in_stack_fffffffffffff820;
                        subControlLayout(layout);
                        ::QVariant::QVariant(&local_1a8,(QList_conflict2 *)local_508);
                        ::QVariant::operator=((QVariant *)this_04,(QVariant *)this_03);
                        ::QVariant::~QVariant(&local_1a8);
                        QList<QVariant>::~QList((QList<QVariant> *)0x422c91);
                        QByteArray::~QByteArray((QByteArray *)0x422c9e);
                        QString::~QString((QString *)0x422cab);
                      }
                    }
                  }
                }
              }
              puVar26 = in_RDI + 10;
              QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                        ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                         0x422d2d);
              this_00 = QHash<QString,_QVariant>::operator[]
                                  ((QHash<QString,_QVariant> *)in_stack_fffffffffffff7f0,
                                   (QString *)this_04);
              ::QVariant::operator=(this_00,(QVariant *)local_c8.data);
              bVar3 = true;
              ::QVariant::~QVariant((QVariant *)&local_c8);
            }
            if (!bVar3) {
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)in_stack_fffffffffffff7f0,(char *)this_04,
                         (int)((ulong)this_03 >> 0x20),(char *)o_01);
              pDVar13 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>
                                    *)0x422dad);
              QtPrivate::asString(&pDVar13->property);
              QString::toLocal8Bit((QString *)in_stack_fffffffffffff7f8);
              pcVar10 = QByteArray::constData((QByteArray *)0x422dd6);
              QMessageLogger::warning(local_570,"Unknown property %s",pcVar10);
              QByteArray::~QByteArray((QByteArray *)0x422dfc);
            }
          }
        }
      }
    }
LAB_00422e06:
    local_628 = local_628 + 1;
  } while( true );
  local_668 = local_668 + 1;
  goto LAB_004221b5;
}

Assistant:

QRenderRule::QRenderRule(const QList<Declaration> &declarations, const QObject *object)
    : features(0),
      hasFont(false),
      pal(nullptr),
      b(nullptr),
      bg(nullptr),
      bd(nullptr),
      ou(nullptr),
      geo(nullptr),
      p(nullptr),
      img(nullptr),
      clipset(0)
{
    QPalette palette = QGuiApplication::palette(); // ###: ideally widget's palette
    ValueExtractor v(declarations, palette);
    features = v.extractStyleFeatures();

    int w = -1, h = -1, minw = -1, minh = -1, maxw = -1, maxh = -1;
    if (v.extractGeometry(&w, &h, &minw, &minh, &maxw, &maxh))
        geo = new QStyleSheetGeometryData(w, h, minw, minh, maxw, maxh);

    int left = 0, top = 0, right = 0, bottom = 0;
    Origin origin = Origin_Unknown;
    Qt::Alignment position;
    QCss::PositionMode mode = PositionMode_Unknown;
    Qt::Alignment textAlignment;
    if (v.extractPosition(&left, &top, &right, &bottom, &origin, &position, &mode, &textAlignment))
        p = new QStyleSheetPositionData(left, top, right, bottom, origin, position, mode, textAlignment);

    int margins[4], paddings[4], spacing = -1;
    for (int i = 0; i < 4; i++)
        margins[i] = paddings[i] = 0;
    if (v.extractBox(margins, paddings, &spacing))
        b = new QStyleSheetBoxData(margins, paddings, spacing);

    int borders[4];
    QBrush colors[4];
    QCss::BorderStyle styles[4];
    QSize radii[4];
    for (int i = 0; i < 4; i++) {
        borders[i] = 0;
        styles[i] = BorderStyle_None;
    }
    if (v.extractBorder(borders, colors, styles, radii))
        bd = new QStyleSheetBorderData(borders, colors, styles, radii);

    int offsets[4];
    for (int i = 0; i < 4; i++) {
        borders[i] = offsets[i] = 0;
        styles[i] = BorderStyle_None;
    }
    if (v.extractOutline(borders, colors, styles, radii, offsets))
        ou = new QStyleSheetOutlineData(borders, colors, styles, radii, offsets);

    QBrush brush;
    QString uri;
    Repeat repeat = Repeat_XY;
    Qt::Alignment alignment = Qt::AlignTop | Qt::AlignLeft;
    Attachment attachment = Attachment_Scroll;
    origin = Origin_Padding;
    Origin clip = Origin_Border;
    if (v.extractBackground(&brush, &uri, &repeat, &alignment, &origin, &attachment, &clip)) {
        QPixmap pixmap = QStyleSheetStyle::loadPixmap(uri, object);
        if (!uri.isEmpty() && pixmap.isNull())
            qWarning("Could not create pixmap from %s", qPrintable(QDir::toNativeSeparators(uri)));
        bg = new QStyleSheetBackgroundData(brush, pixmap, repeat, alignment, origin, attachment, clip);
    }

    QBrush foreground;
    QBrush selectedForeground;
    QBrush selectedBackground;
    QBrush alternateBackground;
    QBrush placeHolderTextForeground;
    QBrush accent;
    if (v.extractPalette(&foreground, &selectedForeground, &selectedBackground,
                         &alternateBackground, &placeHolderTextForeground, &accent)) {
        pal = new QStyleSheetPaletteData(foreground, selectedForeground, selectedBackground,
                                         alternateBackground, placeHolderTextForeground, accent);
    }

    QIcon imgIcon;
    alignment = Qt::AlignCenter;
    QSize imgSize;
    if (v.extractImage(&imgIcon, &alignment, &imgSize))
        img = new QStyleSheetImageData(imgIcon, alignment, imgSize);

    QIcon icon;
    QSize size;
    if (v.extractIcon(&icon, &size))
        iconPtr = new QStyleSheetImageData(icon, Qt::AlignCenter, size);

    int adj = -255;
    hasFont = v.extractFont(&font, &adj);

#if QT_CONFIG(tooltip)
    if (object && qstrcmp(object->metaObject()->className(), "QTipLabel") == 0)
        palette = QToolTip::palette();
#endif

    for (int i = 0; i < declarations.size(); i++) {
        const Declaration& decl = declarations.at(i);
        if (decl.d->propertyId == BorderImage) {
            QString uri;
            QCss::TileMode horizStretch, vertStretch;
            int cuts[4];

            decl.borderImageValue(&uri, cuts, &horizStretch, &vertStretch);
            if (uri.isEmpty() || uri == "none"_L1) {
                if (bd && bd->bi)
                    bd->bi->pixmap = QPixmap();
            } else {
                if (!bd)
                    bd = new QStyleSheetBorderData;
                if (!bd->bi)
                    bd->bi = new QStyleSheetBorderImageData;

                QStyleSheetBorderImageData *bi = bd->bi;
                bi->pixmap = QStyleSheetStyle::loadPixmap(uri, object);
                for (int i = 0; i < 4; i++)
                    bi->cuts[i] = cuts[i];
                bi->horizStretch = horizStretch;
                bi->vertStretch = vertStretch;
            }
        } else if (decl.d->propertyId == QtBackgroundRole) {
            if (bg && bg->brush.style() != Qt::NoBrush)
                continue;
            int role = decl.d->values.at(0).variant.toInt();
            if (role >= Value_FirstColorRole && role <= Value_LastColorRole)
                defaultBackground = palette.color((QPalette::ColorRole)(role-Value_FirstColorRole));
        } else if (decl.d->property.startsWith("qproperty-"_L1, Qt::CaseInsensitive)) {
            // intentionally left blank...
        } else if (decl.d->propertyId == UnknownProperty) {
            bool knownStyleHint = false;
            for (const auto sh : knownStyleHints) {
                QLatin1StringView styleHint(sh);
                if (decl.d->property == styleHint) {
                    QVariant hintValue;
                    if (styleHint.endsWith("alignment"_L1)) {
                        hintValue = (int) decl.alignmentValue();
                    } else if (styleHint.endsWith("color"_L1)) {
                        hintValue = (int) decl.colorValue().rgba();
                    } else if (styleHint.endsWith("size"_L1)) {
                        // Check only for the 'em' case
                        const QString valueString = decl.d->values.at(0).variant.toString();
                        const bool isEmSize = valueString.endsWith(u"em", Qt::CaseInsensitive);
                        if (isEmSize || valueString.endsWith(u"ex", Qt::CaseInsensitive)) {
                            // 1em == size of font; 1ex == xHeight of font
                            // See lengthValueFromData helper in qcssparser.cpp
                            QFont fontForSize(font);
                            // if no font is specified, then use the widget font if possible
                            if (const QWidget *widget; !hasFont && (widget = qobject_cast<const QWidget*>(object)))
                                fontForSize = widget->font();

                            const QFontMetrics fontMetrics(fontForSize);
                            qreal pixelSize = isEmSize ? fontMetrics.height() : fontMetrics.xHeight();

                            // Transform size according to the 'em'/'ex' value
                            qreal emexSize = {};
                            if (decl.realValue(&emexSize, isEmSize ? "em" : "ex") && emexSize > 0) {
                                pixelSize *= emexSize;
                                const QSizeF newSize(pixelSize, pixelSize);
                                decl.d->parsed = QVariant::fromValue<QSizeF>(newSize);
                                hintValue = newSize;
                            } else {
                                qWarning("Invalid '%s' size for %s. Skipping.",
                                         isEmSize ? "em" : "ex", qPrintable(valueString));
                            }
                        } else {
                            // Normal case where we receive a 'px' or 'pt' unit
                            hintValue = decl.sizeValue();
                        }
                    } else if (styleHint.endsWith("icon"_L1)) {
                        hintValue = decl.iconValue();
                    } else if (styleHint == "button-layout"_L1 && decl.d->values.size() != 0
                               && decl.d->values.at(0).type == QCss::Value::String) {
                        hintValue = subControlLayout(decl.d->values.at(0).variant.toString().toLatin1());
                    } else {
                        int integer;
                        decl.intValue(&integer);
                        hintValue = integer;
                    }
                    styleHints[decl.d->property] = hintValue;
                    knownStyleHint = true;
                    break;
                }
            }
            if (!knownStyleHint)
                qWarning("Unknown property %s", qPrintable(decl.d->property));
        }
    }

    if (hasBorder()) {
        if (const QWidget *widget = qobject_cast<const QWidget *>(object)) {
            QStyleSheetStyle *style = const_cast<QStyleSheetStyle *>(globalStyleSheetStyle);
            if (!style)
                style = qt_styleSheet(widget->style());
            if (style)
                fixupBorder(style->nativeFrameWidth(widget));
        }
        if (border()->hasBorderImage())
            defaultBackground = QBrush();
    }
}